

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_widget_is_mouse_clicked(nk_context *ctx,nk_buttons btn)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  undefined1 auVar7 [16];
  nk_rect rect;
  undefined4 extraout_EAX;
  int iVar8;
  int iVar9;
  nk_rect bounds;
  nk_rect local_58;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  undefined8 uStack_30;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4f0f,"int nk_widget_is_mouse_clicked(struct nk_context *, enum nk_buttons)");
  }
  pnVar5 = ctx->current;
  if (pnVar5 != (nk_window *)0x0) {
    iVar9 = 0;
    if (ctx->active == pnVar5) {
      pnVar6 = pnVar5->layout;
      uVar1 = (pnVar6->clip).x;
      uVar3 = (pnVar6->clip).y;
      uVar2 = (pnVar6->clip).w;
      uVar4 = (pnVar6->clip).h;
      local_48 = (float)(int)(float)uVar1;
      fStack_44 = (float)(int)(float)uVar3;
      uStack_40 = 0;
      local_38 = (float)(int)(float)uVar2;
      fStack_34 = (float)(int)(float)uVar4;
      uStack_30 = 0;
      nk_layout_peek(&local_58,ctx);
      auVar7._4_4_ = -(uint)(fStack_34 + fStack_44 < local_58.y);
      auVar7._0_4_ = -(uint)(local_38 + local_48 < local_58.x);
      auVar7._8_4_ = -(uint)(local_58.w + local_58.x < local_48);
      auVar7._12_4_ = -(uint)(local_58.h + local_58.y < fStack_44);
      iVar8 = movmskps(extraout_EAX,auVar7);
      iVar9 = 0;
      if (iVar8 == 0) {
        rect.y = local_58.y;
        rect.x = local_58.x;
        rect.w = local_58.w;
        rect.h = local_58.h;
        iVar9 = nk_input_mouse_clicked(&ctx->input,btn,rect);
      }
    }
    return iVar9;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4f10,"int nk_widget_is_mouse_clicked(struct nk_context *, enum nk_buttons)");
}

Assistant:

NK_API int
nk_widget_is_mouse_clicked(struct nk_context *ctx, enum nk_buttons btn)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_mouse_clicked(&ctx->input, btn, bounds);
}